

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O2

int CRYPTO_get_ex_new_index_ex
              (CRYPTO_EX_DATA_CLASS *ex_data_class,long argl,void *argp,CRYPTO_EX_free *free_func)

{
  uint uVar1;
  CRYPTO_EX_DATA_FUNCS *pCVar2;
  CRYPTO_EX_DATA_FUNCS **ppCVar3;
  int iVar4;
  
  pCVar2 = (CRYPTO_EX_DATA_FUNCS *)OPENSSL_malloc(0x20);
  iVar4 = -1;
  if (pCVar2 != (CRYPTO_EX_DATA_FUNCS *)0x0) {
    pCVar2->argl = argl;
    pCVar2->argp = argp;
    pCVar2->free_func = free_func;
    pCVar2->next = (CRYPTO_EX_DATA_FUNCS *)0x0;
    CRYPTO_MUTEX_lock_write(&ex_data_class->lock);
    uVar1 = (ex_data_class->num_funcs).super___atomic_base<unsigned_int>._M_i;
    if ((ex_data_class->num_reserved ^ 0x7fffffff) < uVar1) {
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ex_data.cc"
                    ,0x3b);
      CRYPTO_MUTEX_unlock_write(&ex_data_class->lock);
    }
    else {
      if (ex_data_class->last == (CRYPTO_EX_DATA_FUNCS *)0x0) {
        if (uVar1 != 0) {
          __assert_fail("num_funcs == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ex_data.cc"
                        ,0x42,
                        "int CRYPTO_get_ex_new_index_ex(CRYPTO_EX_DATA_CLASS *, long, void *, CRYPTO_EX_free *)"
                       );
        }
        ppCVar3 = &ex_data_class->funcs;
      }
      else {
        ppCVar3 = &ex_data_class->last->next;
      }
      *ppCVar3 = pCVar2;
      ex_data_class->last = pCVar2;
      LOCK();
      (ex_data_class->num_funcs).super___atomic_base<unsigned_int>._M_i = uVar1 + 1;
      UNLOCK();
      CRYPTO_MUTEX_unlock_write(&ex_data_class->lock);
      iVar4 = ex_data_class->num_reserved + uVar1;
    }
  }
  return iVar4;
}

Assistant:

int CRYPTO_get_ex_new_index_ex(CRYPTO_EX_DATA_CLASS *ex_data_class, long argl,
                               void *argp, CRYPTO_EX_free *free_func) {
  CRYPTO_EX_DATA_FUNCS *funcs = reinterpret_cast<CRYPTO_EX_DATA_FUNCS *>(
      OPENSSL_malloc(sizeof(CRYPTO_EX_DATA_FUNCS)));
  if (funcs == NULL) {
    return -1;
  }

  funcs->argl = argl;
  funcs->argp = argp;
  funcs->free_func = free_func;
  funcs->next = NULL;

  CRYPTO_MUTEX_lock_write(&ex_data_class->lock);

  uint32_t num_funcs = CRYPTO_atomic_load_u32(&ex_data_class->num_funcs);
  // The index must fit in |int|.
  if (num_funcs > (size_t)(INT_MAX - ex_data_class->num_reserved)) {
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    CRYPTO_MUTEX_unlock_write(&ex_data_class->lock);
    return -1;
  }

  // Append |funcs| to the linked list.
  if (ex_data_class->last == NULL) {
    assert(num_funcs == 0);
    ex_data_class->funcs = funcs;
    ex_data_class->last = funcs;
  } else {
    ex_data_class->last->next = funcs;
    ex_data_class->last = funcs;
  }

  CRYPTO_atomic_store_u32(&ex_data_class->num_funcs, num_funcs + 1);
  CRYPTO_MUTEX_unlock_write(&ex_data_class->lock);
  return (int)num_funcs + ex_data_class->num_reserved;
}